

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O0

void ReleaseObject(Heap *heap,Raw object)

{
  uint8_t uVar1;
  Chuck *pCVar2;
  Chuck *higher;
  Chuck *local_20;
  Chuck *chuck;
  Raw object_local;
  Heap *heap_local;
  
  local_20 = ToChuck(object);
  SetUsed(local_20,'\0');
  pCVar2 = GetHigher(local_20);
  SetHigher(local_20,pCVar2);
  if ((*(uint *)&local_20->field_0x4 & 1) == 0) {
    pCVar2 = GetLower(local_20);
    MoveOut(heap,pCVar2);
    pCVar2 = GetLower(local_20);
    higher = GetHigher(local_20);
    SetHigher(pCVar2,higher);
    local_20 = GetLower(local_20);
    if ((*(uint *)&local_20->field_0x4 & 1) == 0) {
      __assert_fail("chuck->lowerUsed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/Heap.c"
                    ,0x43,"void ReleaseObject(Heap *, Raw)");
    }
  }
  pCVar2 = GetHigher(local_20);
  uVar1 = GetUsed(pCVar2);
  if (uVar1 == '\0') {
    pCVar2 = GetHigher(local_20);
    MoveOut(heap,pCVar2);
    pCVar2 = GetHigher(local_20);
    pCVar2 = GetHigher(pCVar2);
    SetHigher(local_20,pCVar2);
    pCVar2 = GetHigher(local_20);
    uVar1 = GetUsed(pCVar2);
    if (uVar1 == '\0') {
      __assert_fail("GetUsed(GetHigher(chuck))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/Heap.c"
                    ,0x48,"void ReleaseObject(Heap *, Raw)");
    }
  }
  MoveIn(heap,local_20);
  return;
}

Assistant:

void ReleaseObject(Heap *heap, Raw object) {
    Chuck *chuck = ToChuck(object);
    SetUsed(chuck, 0);
    SetHigher(chuck, GetHigher(chuck));
    if (!chuck->lowerUsed) {
        MoveOut(heap, GetLower(chuck));
        SetHigher(GetLower(chuck), GetHigher(chuck));
        chuck = GetLower(chuck);
        assert(chuck->lowerUsed);
    }
    if (!GetUsed(GetHigher(chuck))) {
        MoveOut(heap, GetHigher(chuck));
        SetHigher(chuck, GetHigher(GetHigher(chuck)));
        assert(GetUsed(GetHigher(chuck)));
    }
    MoveIn(heap, chuck);
}